

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

void __thiscall Blob_Detection::BlobDetection::sort(BlobDetection *this,BlobCriterion criterion)

{
  iterator iVar1;
  iterator iVar2;
  undefined8 uVar3;
  undefined4 in_ESI;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
  *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff68;
  imageException *in_stack_ffffffffffffff70;
  
  switch(in_ESI) {
  case 0:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__0>
              (iVar1._M_current,iVar2._M_current);
    break;
  case 1:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__1>
              (iVar1._M_current,iVar2._M_current);
    break;
  case 2:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__2>
              (iVar1._M_current,iVar2._M_current);
    break;
  case 3:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__3>
              (iVar1._M_current,iVar2._M_current);
    break;
  case 4:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__4>
              (iVar1._M_current,iVar2._M_current);
    break;
  case 5:
    iVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_ffffffffffffff38);
    iVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_ffffffffffffff38);
    std::
    sort<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::sort(Blob_Detection::BlobDetection::BlobCriterion)::__5>
              (iVar1._M_current,iVar2._M_current);
    break;
  default:
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

void BlobDetection::sort( BlobCriterion criterion )
    {
        switch( criterion ) {
            case CRITERION_CIRCULARITY:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.circularity() > blob2.circularity(); } );
                break;
            case CRITERION_ELONGATION:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.elongation() > blob2.elongation(); } );
                break;
            case CRITERION_HEIGHT:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.height() > blob2.height(); } );
                break;
            case CRITERION_LENGTH:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.length() > blob2.length(); } );
                break;
            case CRITERION_SIZE:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.size() > blob2.size(); } );
                break;
            case CRITERION_WIDTH:
                std::sort( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.width() > blob2.width(); } );
                break;
            default:
                throw imageException( "Bad criterion for blob sorting" );
        }
    }